

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O1

int mainWithContext(int startArgumentIndex,int argc,char **argv)

{
  int iVar1;
  sysbvm_stackFrameLandingPadRecord_t topLevelFrame;
  sysbvm_stackFrameRecord_t asStack_128 [3];
  __jmp_buf_tag local_f0;
  
  memset(asStack_128,0,0x100);
  asStack_128[0].type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD;
  asStack_128[0]._12_1_ = 1;
  sysbvm_stackFrame_enterContext(context,asStack_128);
  iVar1 = _setjmp(&local_f0);
  if (iVar1 != 0) {
    mainWithContext_cold_1();
  }
  else {
    doMain(startArgumentIndex,argc,argv);
  }
  sysbvm_stackFrame_leaveContext();
  return (uint)(iVar1 != 0);
}

Assistant:

int mainWithContext(int startArgumentIndex, int argc, const char *argv[])
{
    sysbvm_stackFrameLandingPadRecord_t topLevelFrame = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD,
        .keepStackTrace = true
    };

    sysbvm_stackFrame_enterContext(context, (sysbvm_stackFrameRecord_t*)&topLevelFrame);
    int exitCode = 0;
    if(!_setjmp(topLevelFrame.jmpbuffer))
    {
        doMain(startArgumentIndex, argc, argv);
    }
    else
    {
        sysbvm_tuple_t errorString = sysbvm_tuple_asString(context, topLevelFrame.exception);
        fprintf(stderr, "Unhandled exception: " SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(errorString));
        sysbvm_stackFrame_printStackTrace(context, topLevelFrame.stackTrace);
        exitCode = 1;
    }

    sysbvm_stackFrame_leaveContext();
    return exitCode;
}